

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubidi_props.cpp
# Opt level: O2

UChar32 getMirror(UChar32 c,uint16_t props)

{
  short sVar1;
  long lVar2;
  uint uVar3;
  
  sVar1 = (short)((uint)(int)(short)props >> 0xd);
  if (sVar1 != -4) {
    return c + sVar1;
  }
  lVar2 = 0;
  while( true ) {
    if (lVar2 == 0xa0) {
      return c;
    }
    uVar3 = *(uint *)((long)ubidi_props_mirrors + lVar2) & 0x1fffff;
    if (uVar3 == c) break;
    lVar2 = lVar2 + 4;
    if (c < (int)uVar3) {
      return c;
    }
  }
  return ubidi_props_mirrors[*(uint *)((long)ubidi_props_mirrors + lVar2) >> 0x15] & 0x1fffff;
}

Assistant:

static UChar32
getMirror(UChar32 c, uint16_t props) {
    int32_t delta=UBIDI_GET_MIRROR_DELTA(props);
    if(delta!=UBIDI_ESC_MIRROR_DELTA) {
        return c+delta;
    } else {
        /* look for mirror code point in the mirrors[] table */
        const uint32_t *mirrors;
        uint32_t m;
        int32_t i, length;
        UChar32 c2;

        mirrors=ubidi_props_singleton.mirrors;
        length=ubidi_props_singleton.indexes[UBIDI_IX_MIRROR_LENGTH];

        /* linear search */
        for(i=0; i<length; ++i) {
            m=mirrors[i];
            c2=UBIDI_GET_MIRROR_CODE_POINT(m);
            if(c==c2) {
                /* found c, return its mirror code point using the index in m */
                return UBIDI_GET_MIRROR_CODE_POINT(mirrors[UBIDI_GET_MIRROR_INDEX(m)]);
            } else if(c<c2) {
                break;
            }
        }

        /* c not found, return it itself */
        return c;
    }
}